

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_map_with_nested_array(void)

{
  basic_variable<std::allocator<char>> *pbVar1;
  size_type in_RCX;
  size_type sVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_600;
  basic_variable<std::allocator<char>_> *local_5e8;
  basic_variable<std::allocator<char>_> *local_5d0;
  basic_variable<std::allocator<char>_> *local_5a8;
  basic_variable<std::allocator<char>_> *local_590;
  basic_variable<std::allocator<char>_> *local_578;
  basic_variable<std::allocator<char>_> *local_550;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_538;
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 local_4f7 [2];
  undefined1 local_4f5;
  undefined1 local_4f4 [2];
  undefined1 local_4f2;
  undefined1 local_4f1;
  basic_variable<std::allocator<char>_> *local_4f0;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 auStack_488 [32];
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 auStack_408 [32];
  basic_variable<std::allocator<char>_> local_3e8;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [8];
  variable data_2;
  undefined1 local_369;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_337 [2];
  undefined1 local_335;
  undefined1 local_334 [2];
  undefined1 local_332;
  undefined1 local_331;
  basic_variable<std::allocator<char>_> *local_330;
  basic_variable<std::allocator<char>_> local_328;
  basic_variable<std::allocator<char>_> local_2f8;
  undefined1 auStack_2c8 [80];
  basic_variable<std::allocator<char>_> local_278;
  undefined1 auStack_248 [32];
  basic_variable<std::allocator<char>_> local_228;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  variable data_1;
  undefined1 local_1a9;
  basic_variable<std::allocator<char>_> local_1a8;
  undefined1 local_172 [2];
  undefined1 local_170;
  undefined1 local_16f [2];
  undefined1 local_16d;
  basic_variable<std::allocator<char>_> *local_160;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_f8 [72];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_16d = 1;
  local_b0 = &local_a8;
  local_160 = &local_158;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_160,1);
  local_160 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_160,2);
  local_f8._0_8_ = &local_158;
  local_f8._8_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_f8._0_8_,init);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_true>
            (&local_a8,(char (*) [6])"alpha",
             (basic_variable<std::allocator<char>_> *)(local_f8 + 0x10));
  local_16d = 0;
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 1;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init_00);
  local_538 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_538 = local_538 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_538);
  } while (local_538 != &local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f8 + 0x10));
  local_550 = (basic_variable<std::allocator<char>_> *)local_f8;
  do {
    local_550 = local_550 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_550);
  } while (local_550 != &local_158);
  local_16f[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_170 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16d,"void ctor_suite::construct_map_with_nested_array()",local_16f,&local_170);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1a8,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_1a8);
  local_172[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_1a9 = 1;
  sVar2 = 0x16e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16e,"void ctor_suite::construct_map_with_nested_array()",local_172,&local_1a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_332 = 1;
  auStack_248._24_8_ = &local_228;
  local_331 = 1;
  auStack_2c8._24_8_ = auStack_2c8 + 0x20;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_2c8._24_8_,"alpha");
  local_330 = &local_328;
  auStack_2c8._24_8_ = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_330,1);
  local_330 = &local_2f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_330,2);
  auStack_2c8._8_8_ = &local_328;
  auStack_2c8._16_8_ = 2;
  init_01._M_len = sVar2;
  init_01._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&local_278,(basic_array<std::allocator<char>_> *)auStack_2c8._8_8_,init_01);
  local_331 = 0;
  auStack_248._8_8_ = auStack_2c8 + 0x20;
  auStack_248._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_228,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_248 + 8));
  local_332 = 0;
  local_1f8._0_8_ = &local_228;
  local_1f8._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1e8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_1f8);
  local_578 = (basic_variable<std::allocator<char>_> *)local_1f8;
  do {
    local_578 = local_578 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_578);
  } while (local_578 != &local_228);
  local_590 = (basic_variable<std::allocator<char>_> *)auStack_248;
  do {
    local_590 = local_590 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_590);
  } while (local_590 != (basic_variable<std::allocator<char>_> *)(auStack_2c8 + 0x20));
  local_5a8 = (basic_variable<std::allocator<char>_> *)auStack_2c8;
  do {
    local_5a8 = local_5a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5a8);
  } while (local_5a8 != &local_328);
  local_334[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_1e8);
  local_335 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x172,"void ctor_suite::construct_map_with_nested_array()",local_334,&local_335);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_368,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_1e8,&local_368);
  local_337[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_369 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x173,"void ctor_suite::construct_map_with_nested_array()",local_337,&local_369);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1e8);
  local_4f2 = 1;
  auStack_408._24_8_ = &local_3e8;
  local_4f1 = 1;
  auStack_488._24_8_ = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_488._24_8_,"alpha");
  local_4f0 = &local_4e8;
  auStack_488._24_8_ = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,1);
  local_4f0 = &local_4b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,2);
  auStack_488._8_8_ = &local_4e8;
  auStack_488._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_438,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_488 + 8));
  local_4f1 = 0;
  auStack_408._8_8_ = &local_468;
  auStack_408._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_3e8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_408 + 8));
  local_4f2 = 0;
  local_3b8._0_8_ = &local_3e8;
  local_3b8._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_3b8);
  local_5d0 = (basic_variable<std::allocator<char>_> *)local_3b8;
  do {
    local_5d0 = local_5d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5d0);
  } while (local_5d0 != &local_3e8);
  local_5e8 = (basic_variable<std::allocator<char>_> *)auStack_408;
  do {
    local_5e8 = local_5e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5e8);
  } while (local_5e8 != &local_468);
  local_600 = (basic_variable<std::allocator<char>_> *)auStack_488;
  do {
    local_600 = local_600 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_600);
  } while (local_600 != &local_4e8);
  local_4f4[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_3a8);
  local_4f5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x177,"void ctor_suite::construct_map_with_nested_array()",local_4f4,&local_4f5);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_528,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_3a8,&local_528);
  local_4f7[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_529 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x178,"void ctor_suite::construct_map_with_nested_array()",local_4f7,&local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8);
  return;
}

Assistant:

void construct_map_with_nested_array()
{
    {
        variable data(map::make({ {"alpha", array::make({1, 2})} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<array>(), true);
    }
    {
        variable data({ {"alpha", array::make({1, 2})} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<array>(), true);
    }
    {
        variable data({ {"alpha", {1, 2} } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<array>(), true);
    }
}